

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O1

Maybe<capnp::StructSchema::Field> * __thiscall
capnp::StructSchema::findFieldByName
          (Maybe<capnp::StructSchema::Field> *__return_storage_ptr__,StructSchema *this,
          StringPtr name)

{
  ushort uVar1;
  RawSchema *pRVar2;
  NullableValue<capnp::StructSchema::Field> *pNVar3;
  StructSchema SVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong __n;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  Reader RVar12;
  undefined4 uStack_bc;
  StructReader local_b8;
  PointerReader local_88;
  FieldList local_68;
  
  uVar6 = name.content.size_;
  pRVar2 = ((this->super_Schema).raw)->generic;
  getFields(&local_68,this);
  uVar8 = pRVar2->memberCount;
  uVar9 = 0;
  do {
    SVar4.super_Schema.raw = local_68.parent.super_Schema.raw;
    if (uVar8 <= uVar9) {
      (__return_storage_ptr__->ptr).isSet = false;
      return __return_storage_ptr__;
    }
    uVar1 = *(ushort *)((long)pRVar2->membersByName + (ulong)(uVar8 + uVar9 & 0xfffffffe));
    capnp::_::ListReader::getStructElement(&local_b8,&local_68.list.reader,(uint)uVar1);
    local_88.pointer = local_b8.pointers;
    local_88.capTable = local_b8.capTable;
    local_88.segment = local_b8.segment;
    local_88.nestingLimit = local_b8.nestingLimit;
    if (local_b8.pointerCount == 0) {
      local_88.pointer = (WirePointer *)0x0;
      local_88.capTable = (CapTableReader *)0x0;
      local_88.segment = (SegmentReader *)0x0;
      local_88.nestingLimit = 0x7fffffff;
    }
    bVar11 = false;
    RVar12 = capnp::_::PointerReader::getBlob<capnp::Text>(&local_88,(void *)0x0,0);
    uVar7 = RVar12.super_StringPtr.content.size_;
    if (uVar7 == uVar6) {
      iVar5 = bcmp(RVar12.super_StringPtr.content.ptr,name.content.ptr,uVar7 - 1);
      bVar11 = iVar5 == 0;
    }
    if (bVar11) {
      (__return_storage_ptr__->ptr).isSet = true;
      pNVar3 = &__return_storage_ptr__->ptr;
      *(StructDataBitCount *)((long)&pNVar3->field_1 + 0x30) = local_b8.dataSize;
      *(StructPointerCount *)((long)&pNVar3->field_1 + 0x34) = local_b8.pointerCount;
      *(undefined2 *)((long)&pNVar3->field_1 + 0x36) = local_b8._38_2_;
      *(ulong *)&(__return_storage_ptr__->ptr).field_1.value.proto._reader.nestingLimit =
           CONCAT44(local_b8._44_4_,local_b8.nestingLimit);
      (__return_storage_ptr__->ptr).field_1.value.proto._reader.data = local_b8.data;
      (__return_storage_ptr__->ptr).field_1.value.proto._reader.pointers = local_b8.pointers;
      (__return_storage_ptr__->ptr).field_1.value.proto._reader.segment = local_b8.segment;
      (__return_storage_ptr__->ptr).field_1.value.proto._reader.capTable = local_b8.capTable;
      (__return_storage_ptr__->ptr).field_1.value.parent.super_Schema.raw =
           (RawBrandedSchema *)SVar4.super_Schema.raw;
      *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = CONCAT44(uStack_bc,(uint)uVar1)
      ;
      uVar10 = uVar8;
    }
    else {
      __n = uVar6;
      if (uVar7 < uVar6) {
        __n = uVar7;
      }
      iVar5 = memcmp(RVar12.super_StringPtr.content.ptr,name.content.ptr,__n);
      uVar10 = uVar8 + uVar9 >> 1;
      if (iVar5 < 0 || iVar5 == 0 && uVar7 < uVar6) {
        uVar9 = uVar10 + 1;
        uVar10 = uVar8;
      }
    }
    uVar8 = uVar10;
  } while (!bVar11);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<StructSchema::Field> StructSchema::findFieldByName(kj::StringPtr name) const {
  return findSchemaMemberByName(raw->generic, name, getFields());
}